

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O1

shared_ptr<kratos::AssertPropertyStmt> __thiscall
kratos::Stmt::as<kratos::AssertPropertyStmt>(Stmt *this)

{
  size_type *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  shared_ptr<kratos::AssertPropertyStmt> sVar3;
  _func_int **local_28;
  pointer local_20;
  
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x68));
  (this->super_IRNode)._vptr_IRNode = local_28;
  (this->super_IRNode).fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_20;
  if (local_20 != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &(local_20->first)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &(local_20->first)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  _Var2._M_pi = extraout_RDX;
  if (local_20 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::AssertPropertyStmt>)
         sVar3.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> as() {
        return std::static_pointer_cast<T>(shared_from_this());
    }